

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocator_T::~VmaAllocator_T(VmaAllocator_T *this)

{
  uint32_t uVar1;
  VmaAllocator_T *in_RDI;
  size_t memTypeIndex;
  VmaBlockVector *in_stack_ffffffffffffffc8;
  VmaAllocator in_stack_ffffffffffffffd0;
  VmaDedicatedAllocationList *this_00;
  VmaDedicatedAllocationList *local_28;
  ulong local_10;
  
  uVar1 = GetMemoryTypeCount(in_RDI);
  local_10 = (ulong)uVar1;
  while (local_10 != 0) {
    vma_delete<VmaBlockVector>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_10 = local_10 - 1;
  }
  VmaIntrusiveLinkedList<VmaPoolListItemTraits>::~VmaIntrusiveLinkedList(&in_RDI->m_Pools);
  this_00 = in_RDI->m_DedicatedAllocations;
  local_28 = (VmaDedicatedAllocationList *)&in_RDI->m_Budget;
  do {
    local_28 = local_28 + -1;
    VmaDedicatedAllocationList::~VmaDedicatedAllocationList(this_00);
  } while (local_28 != this_00);
  VmaAllocationObjectAllocator::~VmaAllocationObjectAllocator
            ((VmaAllocationObjectAllocator *)0x2fcada);
  return;
}

Assistant:

VmaAllocator_T::~VmaAllocator_T()
{
    VMA_ASSERT(m_Pools.IsEmpty());

    for(size_t memTypeIndex = GetMemoryTypeCount(); memTypeIndex--; )
    {
        vma_delete(this, m_pBlockVectors[memTypeIndex]);
    }
}